

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint in_ECX;
  ImRect *in_RDX;
  ImGuiID in_ESI;
  ImRect *in_RDI;
  bool is_rect_visible;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *local_48;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = in_ESI;
  (pIVar2->LastItemData).Rect.Min = in_RDI->Min;
  (pIVar2->LastItemData).Rect.Max = in_RDI->Max;
  local_48 = in_RDI;
  if (in_RDX != (ImRect *)0x0) {
    local_48 = in_RDX;
  }
  (pIVar2->LastItemData).NavRect.Min = local_48->Min;
  (pIVar2->LastItemData).NavRect.Max = local_48->Max;
  (pIVar2->LastItemData).InFlags = pIVar2->CurrentItemFlags | in_ECX;
  (pIVar2->LastItemData).StatusFlags = 0;
  if ((((in_ESI != 0) && (KeepAliveID(in_ESI), ((pIVar2->LastItemData).InFlags & 8U) == 0)) &&
      (((pIVar1->DC).NavLayersActiveMaskNext =
             (pIVar1->DC).NavLayersActiveMaskNext |
             (ushort)(1 << ((byte)(pIVar1->DC).NavLayerCurrent & 0x1f)), pIVar2->NavId == in_ESI ||
       ((pIVar2->NavAnyRequest & 1U) != 0)))) &&
     ((pIVar2->NavWindow->RootWindowForNav == pIVar1->RootWindowForNav &&
      ((pIVar1 == pIVar2->NavWindow ||
       (((pIVar1->Flags | pIVar2->NavWindow->Flags) & 0x800000U) != 0)))))) {
    NavProcessItem();
  }
  (pIVar2->NextItemData).Flags = 0;
  bVar3 = ImRect::Overlaps(in_RDI,&pIVar1->ClipRect);
  if ((bVar3) ||
     (((in_ESI != 0 && ((in_ESI == pIVar2->ActiveId || (in_ESI == pIVar2->NavId)))) ||
      ((pIVar2->LogEnabled & 1U) != 0)))) {
    if ((in_ESI != 0) && (in_ESI == pIVar2->DebugLocateId)) {
      DebugLocateItemResolveWithLastItem();
    }
    if (bVar3) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 0x200;
    }
    bVar3 = IsMouseHoveringRect((ImVec2 *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                &in_RDI->Min,SUB41(in_ESI >> 0x18,0));
    if (bVar3) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 1;
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        if (!(g.LastItemData.InFlags & ImGuiItemFlags_NoNav))
        {
            window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
            if (g.NavId == id || g.NavAnyRequest)
                if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                    if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                        NavProcessItem();
        }

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    // (FIXME: This is a modified copy of IsClippedEx() so we can reuse the is_rect_visible value)
    //const bool is_clipped = IsClippedEx(bb, id);
    //if (is_clipped)
    //    return false;
    const bool is_rect_visible = bb.Overlaps(window->ClipRect);
    if (!is_rect_visible)
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (!g.LogEnabled)
                return false;

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (id != 0 && id == g.DebugLocateId)
        DebugLocateItemResolveWithLastItem();
#endif
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (is_rect_visible)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Visible;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}